

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O1

void __thiscall
CmdLineArgsParser::ParseNumberPairSet(CmdLineArgsParser *this,NumberPairSet *numberPairSet)

{
  uint32 x;
  uint32 y;
  
  while( true ) {
    x = ParseInteger(this);
    y = 0xffffffff;
    if (*this->pszCurrentArg == L',') {
      this->pszCurrentArg = this->pszCurrentArg + 1;
      y = ParseInteger(this);
    }
    Js::NumberPairSet::Add(numberPairSet,x,y);
    if (*this->pszCurrentArg != L';') break;
    this->pszCurrentArg = this->pszCurrentArg + 1;
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseNumberPairSet(Js::NumberPairSet * numberPairSet)
{
    while (true)
    {
        int line = ParseInteger();
        int col = -1;
        if (CurChar() == ',')
        {
            NextChar();
            col = ParseInteger();
        }

        numberPairSet->Add(line, col);

        if (CurChar() != ';')
        {
            break;
        }
        NextChar();
    }
}